

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::LipmDcmEstimator::setUnbiasedDCM
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *uncertainty)

{
  Matrix4 P;
  Type local_f8;
  Matrix2 local_c8;
  PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> local_a8 [128];
  
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)&local_f8,&(this->filter_).super_KalmanFilterBase)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (local_a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_f8);
  free(local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_0>.m_data);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<2,2>(&local_f8,local_a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_> *)
             &local_f8);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::bottomLeftCorner<2,2>(&local_f8,local_a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_>::setZero
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>_> *)
             &local_f8);
  Vec2ToSqDiag_(&local_c8,uncertainty);
  local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.m_startRow.m_value
       = 0;
  local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.m_startCol.m_value
       = 0;
  local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.m_outerStride = 4;
  local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_0>.m_data =
       (PointerType)local_a8;
  local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.m_xpr =
       (XprTypeNested)local_a8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false>,Eigen::Matrix<double,2,2,0,2,2>>
            (&local_f8,&local_c8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f8,
             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_a8);
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_f8)
  ;
  free(local_f8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_0>.m_data);
  return;
}

Assistant:

void LipmDcmEstimator::setUnbiasedDCM(const Vector2 & dcm, const Vector2 & uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix4 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 2>().setZero();
  P.bottomLeftCorner<2, 2>().setZero();
  P.topLeftCorner<2, 2>() = Vec2ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}